

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsio.c
# Opt level: O3

void complete_send_item(LIST_ITEM_HANDLE pending_io_list_item,IO_SEND_RESULT io_send_result)

{
  int iVar1;
  undefined8 *__ptr;
  LOGGER_LOG p_Var2;
  
  __ptr = (undefined8 *)singlylinkedlist_item_get_value(pending_io_list_item);
  if (__ptr == (undefined8 *)0x0) {
    return;
  }
  if (__ptr[2] != 0) {
    iVar1 = singlylinkedlist_remove
                      (*(SINGLYLINKEDLIST_HANDLE *)(__ptr[2] + 0x48),pending_io_list_item);
    if (iVar1 == 0) goto LAB_00139672;
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
              ,"complete_send_item",0x4a,1,"Failed removing pending IO from linked list.");
  }
LAB_00139672:
  if ((code *)*__ptr != (code *)0x0) {
    (*(code *)*__ptr)(__ptr[1],io_send_result);
  }
  free(__ptr);
  return;
}

Assistant:

static void complete_send_item(LIST_ITEM_HANDLE pending_io_list_item, IO_SEND_RESULT io_send_result)
{
    PENDING_IO* pending_io = (PENDING_IO*)singlylinkedlist_item_get_value(pending_io_list_item);
    if (pending_io != NULL)
    {
        WSIO_INSTANCE* wsio_instance = (WSIO_INSTANCE*)pending_io->wsio;

        /* Codes_SRS_WSIO_01_145: [ Removing it from the list shall be done by calling singlylinkedlist_remove. ]*/
        if (wsio_instance == NULL ||
            singlylinkedlist_remove(wsio_instance->pending_io_list, pending_io_list_item) != 0)
        {
            LogError("Failed removing pending IO from linked list.");
        }

        /* Codes_SRS_WSIO_01_105: [ The argument on_send_complete shall be optional, if NULL is passed by the caller then no send complete callback shall be triggered. ]*/
        if (pending_io->on_send_complete != NULL)
        {
            pending_io->on_send_complete(pending_io->callback_context, io_send_result);
        }

        /* Codes_SRS_WSIO_01_144: [ Also the pending IO data shall be freed. ]*/
        free(pending_io);
    }
}